

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class1_test_matching.cc
# Opt level: O0

int main(int argc,char **argv)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  char *pcVar1;
  ostream *poVar2;
  shared_ptr<core::Image<unsigned_char>_> local_128;
  shared_ptr<core::Image<unsigned_char>_> local_118;
  undefined4 local_104;
  exception *e;
  shared_ptr<core::Image<unsigned_char>_> local_e8;
  allocator local_d1;
  string local_d0 [32];
  shared_ptr<core::Image<unsigned_char>_> local_b0;
  shared_ptr<const_core::Image<unsigned_char>_> local_a0;
  shared_ptr<core::Image<unsigned_char>_> local_90;
  allocator local_79;
  string local_78 [32];
  shared_ptr<core::Image<unsigned_char>_> local_58 [2];
  undefined1 local_38 [8];
  Ptr image2;
  Ptr image1;
  char **argv_local;
  int argc_local;
  
  if (2 < argc) {
    poVar2 = std::operator<<((ostream *)&std::cout,"SSE2 is enabled!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::shared_ptr<core::Image<unsigned_char>_>::shared_ptr
              ((shared_ptr<core::Image<unsigned_char>_> *)
               &image2.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<core::Image<unsigned_char>_>::shared_ptr
              ((shared_ptr<core::Image<unsigned_char>_> *)local_38);
    poVar2 = std::operator<<((ostream *)&std::cout,"Loading ");
    poVar2 = std::operator<<(poVar2,argv[1]);
    poVar2 = std::operator<<(poVar2,"...");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,pcVar1,&local_79);
    core::image::load_file((image *)local_58,(string *)local_78);
    this = &image2.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    std::shared_ptr<core::Image<unsigned_char>_>::operator=
              ((shared_ptr<core::Image<unsigned_char>_> *)this,local_58);
    std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr(local_58);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::shared_ptr<core::Image<unsigned_char>const>::shared_ptr<core::Image<unsigned_char>,void>
              ((shared_ptr<core::Image<unsigned_char>const> *)&local_a0,
               (shared_ptr<core::Image<unsigned_char>_> *)this);
    core::image::rescale_half_size<unsigned_char>((image *)&local_90,(ConstPtr *)&local_a0);
    std::shared_ptr<core::Image<unsigned_char>_>::operator=
              ((shared_ptr<core::Image<unsigned_char>_> *)
               &image2.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_90);
    std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr(&local_90);
    std::shared_ptr<const_core::Image<unsigned_char>_>::~shared_ptr(&local_a0);
    poVar2 = std::operator<<((ostream *)&std::cout,"Loading ");
    poVar2 = std::operator<<(poVar2,argv[2]);
    poVar2 = std::operator<<(poVar2,"...");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pcVar1 = argv[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,pcVar1,&local_d1);
    core::image::load_file((image *)&local_b0,(string *)local_d0);
    std::shared_ptr<core::Image<unsigned_char>_>::operator=
              ((shared_ptr<core::Image<unsigned_char>_> *)local_38,&local_b0);
    std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr(&local_b0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::shared_ptr<core::Image<unsigned_char>const>::shared_ptr<core::Image<unsigned_char>,void>
              ((shared_ptr<core::Image<unsigned_char>const> *)&e,
               (shared_ptr<core::Image<unsigned_char>_> *)local_38);
    core::image::rescale_half_size<unsigned_char>((image *)&local_e8,(ConstPtr *)&e);
    std::shared_ptr<core::Image<unsigned_char>_>::operator=
              ((shared_ptr<core::Image<unsigned_char>_> *)local_38,&local_e8);
    std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr(&local_e8);
    std::shared_ptr<const_core::Image<unsigned_char>_>::~shared_ptr
              ((shared_ptr<const_core::Image<unsigned_char>_> *)&e);
    std::shared_ptr<core::Image<unsigned_char>_>::shared_ptr
              (&local_118,
               (shared_ptr<core::Image<unsigned_char>_> *)
               &image2.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<core::Image<unsigned_char>_>::shared_ptr
              (&local_128,(shared_ptr<core::Image<unsigned_char>_> *)local_38);
    feature_set_matching(&local_118,&local_128);
    std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr(&local_128);
    std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr(&local_118);
    local_104 = 1;
    std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr
              ((shared_ptr<core::Image<unsigned_char>_> *)local_38);
    std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr
              ((shared_ptr<core::Image<unsigned_char>_> *)
               &image2.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Syntax: ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2," image1 image2");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  argv_local._4_4_ = (uint)(2 >= argc);
  return argv_local._4_4_;
}

Assistant:

int
main (int argc, char** argv)
{
    if (argc < 3)
    {
        std::cerr << "Syntax: " << argv[0] << " image1 image2" << std::endl;
        return 1;
    }

 // 用于加速
#ifdef __SSE2__
    std::cout << "SSE2 is enabled!" << std::endl;
#endif
#ifdef __SSE3__
    std::cout << "SSE3 is enabled!" << std::endl;
#endif

    /* Regular two-view matching. */
    core::ByteImage::Ptr image1, image2;
    try
    {
        std::cout << "Loading " << argv[1] << "..." << std::endl;
        image1 = core::image::load_file(std::string(argv[1]));
        // 图像尺寸减半
        image1 = core::image::rescale_half_size<uint8_t>(image1);
        //image1 = core::image::rescale_half_size<uint8_t>(image1);
        //image1 = core::image::rotate<uint8_t>(image1, core::image::ROTATE_CCW);

        std::cout << "Loading " << argv[2] << "..." << std::endl;
        image2 = core::image::load_file(argv[2]);
        // 图像尺寸减半
        image2 = core::image::rescale_half_size<uint8_t>(image2);
        //image2 = core::image::rescale_half_size<uint8_t>(image2);
        //image2 = core::image::rotate<uint8_t>(image2, core::image::ROTATE_CCW);
    }
    catch (std::exception& e)
    {
        std::cerr << "Error: " << e.what() << std::endl;
        return 1;
    }

    // 进行特征提取和特征匹配
    feature_set_matching(image1, image2);

    return 0;
}